

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationTest.cpp
# Opt level: O0

void __thiscall ninx_evaluation::test_simple_operator::test_method(test_simple_operator *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b8;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80;
  locale local_70 [31];
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string output;
  test_simple_operator *this_local;
  
  output.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "\n@func bold($body) {\\<b\\>$body\\<\\/b\\>}\n@operator bold *\n\nThis text can be *bold*\n"
             ,&local_51);
  eval((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::locale::locale(local_70);
  boost::algorithm::trim<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,local_70)
  ;
  std::locale::~locale(local_70);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/evaluation/EvaluationTest.cpp"
               ,0x6f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_90);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_80,0x15e,&local_90);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b8,prev,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/evaluation/EvaluationTest.cpp"
               ,0x6f);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[29]>
              (&local_b8,&local_c8,0x15e,1,2,local_30,"output","This text can be <b>bold</b>",
               "\"This text can be <b>bold</b>\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_simple_operator) {
        auto output{eval(
                R"NINX(
@func bold($body) {\<b\>$body\<\/b\>}
@operator bold *

This text can be *bold*
)NINX"
        )};

        boost::trim(output);

        BOOST_CHECK_EQUAL(output, "This text can be <b>bold</b>");
    }